

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relax_float_ops_pass.h
# Opt level: O2

void __thiscall spvtools::opt::RelaxFloatOpsPass::RelaxFloatOpsPass(RelaxFloatOpsPass *this)

{
  Pass::Pass(&this->super_Pass);
  (this->super_Pass)._vptr_Pass = (_func_int **)&PTR__RelaxFloatOpsPass_003ae1d0;
  (this->target_ops_core_f_rslt_)._M_h._M_buckets =
       &(this->target_ops_core_f_rslt_)._M_h._M_single_bucket;
  (this->target_ops_core_f_rslt_)._M_h._M_bucket_count = 1;
  (this->target_ops_core_f_rslt_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->target_ops_core_f_rslt_)._M_h._M_element_count = 0;
  (this->target_ops_core_f_rslt_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->target_ops_core_f_rslt_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->target_ops_core_f_rslt_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->target_ops_core_f_opnd_)._M_h._M_buckets =
       &(this->target_ops_core_f_opnd_)._M_h._M_single_bucket;
  (this->target_ops_core_f_opnd_)._M_h._M_bucket_count = 1;
  (this->target_ops_core_f_opnd_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->target_ops_core_f_opnd_)._M_h._M_element_count = 0;
  (this->target_ops_core_f_opnd_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->target_ops_core_f_opnd_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->target_ops_core_f_opnd_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->target_ops_450_)._M_h._M_buckets = &(this->target_ops_450_)._M_h._M_single_bucket;
  (this->target_ops_450_)._M_h._M_bucket_count = 1;
  (this->target_ops_450_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->target_ops_450_)._M_h._M_element_count = 0;
  (this->target_ops_450_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->target_ops_450_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->target_ops_450_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->sample_ops_)._M_h._M_buckets = &(this->sample_ops_)._M_h._M_single_bucket;
  (this->sample_ops_)._M_h._M_bucket_count = 1;
  (this->sample_ops_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->sample_ops_)._M_h._M_element_count = 0;
  (this->sample_ops_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->sample_ops_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->sample_ops_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

RelaxFloatOpsPass() : Pass() {}